

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O1

int bb_i2c_open(uint SDA,uint SCL,uint baud)

{
  int iVar1;
  uint baud_local;
  gpioExtent_t ext [1];
  
  ext[0].ptr = &baud_local;
  ext[0].size = 4;
  baud_local = baud;
  iVar1 = pigpio_command_ext(gPigCommand,0x5a,SDA,SCL,4,1,ext,1);
  return iVar1;
}

Assistant:

int bb_i2c_open(unsigned SDA, unsigned SCL, unsigned baud)
{
   gpioExtent_t ext[1];

   /*
   p1=SDA
   p2=SCL
   p3=4
   ## extension ##
   uint32_t baud
   */

   ext[0].size = sizeof(uint32_t);
   ext[0].ptr = &baud;

   return pigpio_command_ext
      (gPigCommand, PI_CMD_BI2CO, SDA, SCL, 4, 1, ext, 1);
}